

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NullTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::NullTypeHandlerBase::FreezeImpl
          (NullTypeHandlerBase *this,DynamicObject *instance,bool isConvertedType)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  DictionaryTypeHandler *pDVar2;
  
  pDVar2 = ConvertToDictionaryType(this,instance);
  UNRECOVERED_JUMPTABLE = (pDVar2->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[99];
  iVar1 = (*UNRECOVERED_JUMPTABLE)(pDVar2,instance,1,UNRECOVERED_JUMPTABLE);
  return iVar1;
}

Assistant:

BOOL NullTypeHandlerBase::FreezeImpl(DynamicObject* instance, bool isConvertedType)
    {
        return ConvertToDictionaryType(instance)->Freeze(instance, true);
    }